

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void print_type(c2m_ctx_t c2m_ctx,FILE *f,type *type)

{
  int iVar1;
  node_t_conflict pnVar2;
  char *pcVar3;
  size_t sStack_20;
  
  switch(type->mode) {
  case TM_UNDEF:
    pcVar3 = "undef type mode";
    sStack_20 = 0xf;
    goto LAB_0014d60a;
  case TM_BASIC:
    print_basic_type(f,(type->u).basic_type);
    break;
  case TM_ENUM:
    pnVar2 = (type->u).tag_type;
    pcVar3 = "enum node %u";
    goto LAB_0014d6a3;
  case TM_PTR:
    fwrite("ptr (",5,1,(FILE *)f);
    print_type(c2m_ctx,f,(type->u).ptr_type);
    fputc(0x29,(FILE *)f);
    if (type->arr_type != (type *)0x0) {
      fwrite(", former ",9,1,(FILE *)f);
      print_type(c2m_ctx,f,type->arr_type);
    }
    if (type->func_type_before_adjustment_p == '\0') break;
    pcVar3 = ", former func";
    sStack_20 = 0xd;
LAB_0014d60a:
    fwrite(pcVar3,sStack_20,1,(FILE *)f);
    break;
  case TM_STRUCT:
    pnVar2 = (type->u).tag_type;
    pcVar3 = "struct node %u";
    goto LAB_0014d6a3;
  case TM_UNION:
    pnVar2 = (type->u).tag_type;
    pcVar3 = "union node %u";
LAB_0014d6a3:
    fprintf((FILE *)f,pcVar3,(ulong)pnVar2->uid);
    break;
  case TM_ARR:
    pcVar3 = "static ";
    if ((((type->u).tag_type)->code & N_I) == N_IGNORE) {
      pcVar3 = "";
    }
    fprintf((FILE *)f,"array [%s",pcVar3);
    print_qual(f,((type->u).arr_type)->ind_type_qual);
    fprintf((FILE *)f,"size node %u] (",(ulong)((((type->u).tag_type)->op_link).next)->uid);
    print_type(c2m_ctx,f,((type->u).ptr_type)->arr_type);
    fputc(0x29,(FILE *)f);
    break;
  case TM_FUNC:
    fwrite("func ",5,1,(FILE *)f);
    print_type(c2m_ctx,f,((type->u).ptr_type)->arr_type);
    fprintf((FILE *)f,"(params node %u",(ulong)((((type->u).tag_type)->op_link).prev)->uid);
    pcVar3 = ", ...)";
    if ((((type->u).tag_type)->code & N_I) == N_IGNORE) {
      pcVar3 = ")";
    }
    fprintf((FILE *)f,pcVar3);
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x3584,"void print_type(c2m_ctx_t, FILE *, struct type *)");
  }
  print_qual(f,type->type_qual);
  iVar1 = incomplete_type_p(c2m_ctx,type);
  if (iVar1 != 0) {
    fwrite(", incomplete",0xc,1,(FILE *)f);
  }
  if (type->raw_size != 0xffffffffffffffff) {
    fprintf((FILE *)f,", raw size = %llu");
  }
  if (-1 < type->align) {
    fprintf((FILE *)f,", align = %d");
  }
  fputc(0x20,(FILE *)f);
  return;
}

Assistant:

static void print_type (c2m_ctx_t c2m_ctx, FILE *f, struct type *type) {
  switch (type->mode) {
  case TM_UNDEF: fprintf (f, "undef type mode"); break;
  case TM_BASIC: print_basic_type (f, type->u.basic_type); break;
  case TM_ENUM: fprintf (f, "enum node %u", type->u.tag_type->uid); break;
  case TM_PTR:
    fprintf (f, "ptr (");
    print_type (c2m_ctx, f, type->u.ptr_type);
    fprintf (f, ")");
    if (type->arr_type != NULL) {
      fprintf (f, ", former ");
      print_type (c2m_ctx, f, type->arr_type);
    }
    if (type->func_type_before_adjustment_p) fprintf (f, ", former func");
    break;
  case TM_STRUCT: fprintf (f, "struct node %u", type->u.tag_type->uid); break;
  case TM_UNION: fprintf (f, "union node %u", type->u.tag_type->uid); break;
  case TM_ARR:
    fprintf (f, "array [%s", type->u.arr_type->static_p ? "static " : "");
    print_qual (f, type->u.arr_type->ind_type_qual);
    fprintf (f, "size node %u] (", type->u.arr_type->size->uid);
    print_type (c2m_ctx, f, type->u.arr_type->el_type);
    fprintf (f, ")");
    break;
  case TM_FUNC:
    fprintf (f, "func ");
    print_type (c2m_ctx, f, type->u.func_type->ret_type);
    fprintf (f, "(params node %u", type->u.func_type->param_list->uid);
    fprintf (f, type->u.func_type->dots_p ? ", ...)" : ")");
    break;
  default: assert (FALSE);
  }
  print_qual (f, type->type_qual);
  if (incomplete_type_p (c2m_ctx, type)) fprintf (f, ", incomplete");
  if (type->raw_size != MIR_SIZE_MAX)
    fprintf (f, ", raw size = %llu", (unsigned long long) type->raw_size);
  if (type->align >= 0) fprintf (f, ", align = %d", type->align);
  fprintf (f, " ");
}